

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# inja.hpp
# Opt level: O2

ostream * __thiscall
inja::Environment::render_to(Environment *this,ostream *os,Template *tmpl,json *data)

{
  _Head_base<0UL,_inja::Environment::Impl_*,_false> _Var1;
  Renderer local_90;
  
  _Var1._M_head_impl =
       (this->m_impl)._M_t.
       super___uniq_ptr_impl<inja::Environment::Impl,_std::default_delete<inja::Environment::Impl>_>
       ._M_t.
       super__Tuple_impl<0UL,_inja::Environment::Impl_*,_std::default_delete<inja::Environment::Impl>_>
       .super__Head_base<0UL,_inja::Environment::Impl_*,_false>._M_head_impl;
  Renderer::Renderer(&local_90,&(_Var1._M_head_impl)->included_templates,
                     &(_Var1._M_head_impl)->callbacks);
  Renderer::render_to(&local_90,os,tmpl,data);
  Renderer::~Renderer(&local_90);
  return os;
}

Assistant:

std::ostream& render_to(std::ostream& os, const Template& tmpl, const json& data) {
		Renderer(m_impl->included_templates, m_impl->callbacks).render_to(os, tmpl, data);
		return os;
	}